

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

const_iterator __thiscall QHash<QString,_QString>::begin(QHash<QString,_QString> *this)

{
  ulong uVar1;
  Data *pDVar2;
  ulong uVar3;
  const_iterator cVar4;
  const_iterator cVar5;
  
  pDVar2 = this->d;
  if (pDVar2 == (Data *)0x0) {
    pDVar2 = (Data *)0x0;
  }
  else if (pDVar2->spans->offsets[0] == 0xff) {
    uVar1 = 1;
    do {
      uVar3 = uVar1;
      if (pDVar2->numBuckets == uVar3) {
        return (piter)ZEXT816(0);
      }
      uVar1 = uVar3 + 1;
    } while (pDVar2->spans[uVar3 >> 7].offsets[(uint)uVar3 & 0x7f] == 0xff);
    cVar4.i.bucket = uVar3;
    cVar4.i.d = pDVar2;
    return (const_iterator)cVar4.i;
  }
  cVar5.i.bucket = 0;
  cVar5.i.d = pDVar2;
  return (const_iterator)cVar5.i;
}

Assistant:

inline const_iterator begin() const noexcept { return d ? const_iterator(d->begin()): const_iterator(); }